

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O2

void __thiscall capnp::compiler::NodeTranslator::compileStruct(NodeTranslator *this)

{
  Builder builder;
  Reader members;
  undefined8 in_stack_00000008;
  undefined8 in_stack_00000010;
  undefined8 in_stack_00000018;
  undefined8 in_stack_00000020;
  undefined8 in_stack_00000028;
  undefined8 in_stack_00000030;
  SegmentBuilder *in_stack_00000038;
  CapTableBuilder *in_stack_00000040;
  void *in_stack_00000048;
  WirePointer *in_stack_00000050;
  undefined8 in_stack_00000058;
  Builder local_2b0;
  StructTranslator local_288;
  MemberInfo local_1a8;
  
  local_288.implicitMethodParams.params.reader._24_6_ = 0;
  local_288.implicitMethodParams.params.reader._30_8_ = 0;
  local_288.implicitMethodParams.params.reader.capTable = (CapTableReader *)0x0;
  local_288.implicitMethodParams.params.reader.ptr._0_6_ = 0;
  local_288.implicitMethodParams.params.reader.ptr._6_2_ = 0;
  local_288.implicitMethodParams.scopeId = 0;
  local_288.implicitMethodParams.params.reader.segment = (SegmentReader *)0x0;
  local_288.errorReporter = this->errorReporter;
  local_288.implicitMethodParams.params.reader.elementSize = INLINE_COMPOSITE;
  local_288.implicitMethodParams.params.reader.nestingLimit = 0x7fffffff;
  local_288.layout.top.super_StructOrGroup._vptr_StructOrGroup = (_func_int **)&PTR_addVoid_00676500
  ;
  local_288.layout.top.dataWordCount = 0;
  local_288.layout.top.pointerCount = 0;
  local_288.layout.top.holes.holes[0] = 0;
  local_288.layout.top.holes.holes[1] = 0;
  local_288.layout.top.holes.holes[2] = 0;
  local_288.layout.top.holes.holes[3] = 0;
  local_288.layout.top.holes.holes[4] = 0;
  local_288.layout.top.holes.holes[5] = 0;
  local_288.translator = this;
  kj::Arena::Arena(&local_288.arena,0x400);
  local_288.membersByOrdinal._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_288.membersByOrdinal._M_t._M_impl.super__Rb_tree_header._M_header;
  local_288.membersByOrdinal._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_288.membersByOrdinal._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  local_288.membersByOrdinal._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_288.allMembers.builder.ptr = (MemberInfo **)0x0;
  local_288.allMembers.builder.pos =
       (RemoveConst<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*> *)0x0;
  local_288.allMembers.builder.endPtr = (MemberInfo **)0x0;
  local_288.membersByOrdinal._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_288.membersByOrdinal._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  capnp::_::OrphanGetImpl<capnp::schema::Node::SourceInfo,_(capnp::Kind)3>::apply
            (&local_2b0,&(this->sourceInfo).builder);
  local_1a8.sourceInfo._builder.dataSize = local_2b0._builder.dataSize;
  local_1a8.sourceInfo._builder.pointerCount = local_2b0._builder.pointerCount;
  local_1a8.sourceInfo._builder._38_2_ = local_2b0._builder._38_2_;
  local_1a8.sourceInfo._builder.data = local_2b0._builder.data;
  local_1a8.sourceInfo._builder.pointers = local_2b0._builder.pointers;
  local_1a8.sourceInfo._builder.segment = local_2b0._builder.segment;
  local_1a8.sourceInfo._builder.capTable = local_2b0._builder.capTable;
  local_1a8.node._builder._32_8_ = in_stack_00000058;
  local_1a8.node._builder.data = in_stack_00000048;
  local_1a8.node._builder.pointers = in_stack_00000050;
  local_1a8.node._builder.segment = in_stack_00000038;
  local_1a8.node._builder.capTable = in_stack_00000040;
  local_1a8.parent = (MemberInfo *)0x0;
  local_1a8._8_5_ = 0;
  local_1a8.index._1_3_ = 0;
  local_1a8._16_5_ = 0;
  local_1a8._21_8_ = 0;
  local_1a8.name.content.ptr = "";
  local_1a8.name.content.size_ = 1;
  local_1a8.declId._reader.segment = (SegmentReader *)0x0;
  local_1a8.declId._reader.capTable = (CapTableReader *)0x0;
  local_1a8.declId._reader.data = (void *)0x0;
  local_1a8.declId._reader.pointers._0_6_ = 0;
  local_1a8.declId._reader.pointers._6_2_ = 0;
  local_1a8.declId._reader.dataSize = 0;
  local_1a8.declId._reader.pointerCount = 0;
  local_1a8.declId._reader.nestingLimit = 0x7fffffff;
  local_1a8.isParam = false;
  local_1a8.hasDefaultValue = false;
  local_1a8.fieldType._reader.data = (void *)0x0;
  local_1a8.fieldType._reader.pointers._0_6_ = 0;
  local_1a8.fieldType._reader.pointers._6_2_ = 0;
  local_1a8.fieldType._reader.dataSize = 0;
  local_1a8.fieldType._reader.pointerCount = 0;
  local_1a8.fieldType._reader.segment = (SegmentReader *)0x0;
  local_1a8.fieldType._reader.capTable = (CapTableReader *)0x0;
  local_1a8.fieldType._reader.nestingLimit = 0x7fffffff;
  local_1a8.fieldDefaultValue._reader.data = (void *)0x0;
  local_1a8.fieldDefaultValue._reader.pointers._0_6_ = 0;
  local_1a8.fieldDefaultValue._reader.segment = (SegmentReader *)0x0;
  local_1a8.fieldDefaultValue._reader.capTable = (CapTableReader *)0x0;
  local_1a8.fieldDefaultValue._reader.pointers._6_2_ = 0;
  local_1a8.fieldDefaultValue._reader.dataSize = 0;
  local_1a8.fieldDefaultValue._reader.pointerCount = 0;
  local_1a8.fieldDefaultValue._reader.nestingLimit = 0x7fffffff;
  local_1a8.declAnnotations.reader.ptr = (byte *)0x0;
  local_1a8.declAnnotations.reader._24_6_ = 0;
  local_1a8.declAnnotations.reader.step._2_2_ = 0;
  local_1a8.declAnnotations.reader.structDataSize = 0;
  local_1a8.declAnnotations.reader.structPointerCount = 0;
  local_1a8.declAnnotations.reader.segment = (SegmentReader *)0x0;
  local_1a8.declAnnotations.reader.capTable = (CapTableReader *)0x0;
  local_1a8.declAnnotations.reader.elementSize = INLINE_COMPOSITE;
  local_1a8.declAnnotations.reader.nestingLimit = 0x7fffffff;
  local_1a8.schema.ptr.isSet = false;
  local_1a8.startByte = 0;
  local_1a8.endByte = 0;
  local_1a8.docComment.ptr.isSet = false;
  local_1a8.field_21.fieldScope = (StructOrGroup *)0x0;
  members.reader.capTable = (CapTableReader *)in_stack_00000010;
  members.reader.segment = (SegmentReader *)in_stack_00000008;
  members.reader.ptr = (byte *)in_stack_00000018;
  members.reader._24_8_ = in_stack_00000020;
  members.reader._32_8_ = in_stack_00000028;
  members.reader._40_8_ = in_stack_00000030;
  StructTranslator::traverseTopOrGroup
            (&local_288,members,&local_1a8,(StructOrGroup *)&local_288.layout);
  builder._builder.capTable = in_stack_00000040;
  builder._builder.segment = in_stack_00000038;
  builder._builder.data = in_stack_00000048;
  builder._builder.pointers = in_stack_00000050;
  builder._builder._32_8_ = in_stack_00000058;
  StructTranslator::translateInternal(&local_288,&local_1a8,builder);
  StructTranslator::~StructTranslator(&local_288);
  return;
}

Assistant:

void NodeTranslator::compileStruct(Void decl, List<Declaration>::Reader members,
                                   schema::Node::Builder builder) {
  StructTranslator(*this, noImplicitParams()).translate(decl, members, builder, sourceInfo.get());
}